

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_AlmostDoubleEq_Test::
iu_SyntaxTest_x_iutest_x_AlmostDoubleEq_Test(iu_SyntaxTest_x_iutest_x_AlmostDoubleEq_Test *this)

{
  iu_SyntaxTest_x_iutest_x_AlmostDoubleEq_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_AlmostDoubleEq_Test_00627718;
  return;
}

Assistant:

IUTEST(SyntaxTest, AlmostDoubleEq)
{
    if( double x = 1.0 )
        IUTEST_ASSERT_ALMOST_EQ(1.0, x);
    if( double x = 1.0 )
        IUTEST_EXPECT_ALMOST_EQ(1.0, x);
    if( double x = 1.0 )
        IUTEST_INFORM_ALMOST_EQ(1.0, x);
    if( double x = 1.0 )
        IUTEST_ASSUME_ALMOST_EQ(1.0, x);
}